

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::LowBDConvolveHorizRSTest_DISABLED_Speed_Test::TestBody
          (LowBDConvolveHorizRSTest_DISABLED_Speed_Test *this)

{
  ConvolveHorizRSTestBase<unsigned_char> *in_stack_00000120;
  
  ConvolveHorizRSTestBase<unsigned_char>::SpeedTest(in_stack_00000120);
  return;
}

Assistant:

TEST_P(LowBDConvolveHorizRSTest, DISABLED_Speed) { SpeedTest(); }